

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O1

void __thiscall
JFSON::Value<(JFSON::Json::Type)4,_std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>_>::dump
          (Value<(JFSON::Json::Type)4,_std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>_>
           *this,string *out)

{
  pointer pJVar1;
  element_type *peVar2;
  bool bVar3;
  Json *value;
  pointer pJVar4;
  
  std::__cxx11::string::append((char *)out);
  pJVar4 = (this->m_value).super__Vector_base<JFSON::Json,_std::allocator<JFSON::Json>_>._M_impl.
           super__Vector_impl_data._M_start;
  pJVar1 = (this->m_value).super__Vector_base<JFSON::Json,_std::allocator<JFSON::Json>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pJVar4 != pJVar1) {
    bVar3 = true;
    do {
      if (!bVar3) {
        std::__cxx11::string::append((char *)out);
      }
      peVar2 = (pJVar4->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar2->_vptr_JsonValue[3])(peVar2,out);
      pJVar4 = pJVar4 + 1;
      bVar3 = false;
    } while (pJVar4 != pJVar1);
  }
  std::__cxx11::string::append((char *)out);
  return;
}

Assistant:

void dump(string &out) const override { JFSON::dump(m_value, out); }